

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tester.h
# Opt level: O2

void __thiscall MemVector<unsigned_int>::~MemVector(MemVector<unsigned_int> *this)

{
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->accesses_).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)this);
  return;
}

Assistant:

MemVector() {}